

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O3

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
do_deliver_message_to_subscriber
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this,
          subscriber_info_t *agent_info,deliver_op_tracer *tracer,type_index *msg_type,
          message_ref_t *message,uint overlimit_reaction_deep)

{
  anon_class_40_5_1f61f8e0 delivery_action;
  int iVar1;
  
  if (agent_info->m_state != only_filter) {
    if ((agent_info->m_state == subscriptions_and_filter) &&
       (iVar1 = (*agent_info->m_filter->_vptr_delivery_filter_t[2])
                          (agent_info->m_filter,agent_info->m_agent,message->m_obj),
       (char)iVar1 == '\0')) {
      return;
    }
    delivery_action.agent_info = agent_info;
    delivery_action.tracer = tracer;
    delivery_action.this = this;
    delivery_action.msg_type = msg_type;
    delivery_action.message = message;
    message_limit::impl::
    try_to_deliver_to_agent<so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::do_deliver_message_to_subscriber(so_5::impl::local_mbox_details::subscriber_info_t_const&,so_5::impl::msg_tracing_helpers::tracing_disabled_base::deliver_op_tracer_const&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,unsigned_int)const::_lambda()_1_>
              (event,agent_info->m_agent,agent_info->m_limit,msg_type,message,
               overlimit_reaction_deep,(action_msg_tracer_t *)0x0,delivery_action);
  }
  return;
}

Assistant:

delivery_possibility_t
	must_be_delivered(
		message_t & msg ) const
	{
		// For the case when there are actual subscriptions.
		// We assume that will be in 99.9% cases.
		auto need_deliver = delivery_possibility_t::must_be_delivered;

		if( state_t::only_filter == m_state )
			// Only filter, no actual subscriptions.
			// No message delivery for that case.
			need_deliver = delivery_possibility_t::no_subscription;
		else if( state_t::subscriptions_and_filter == m_state )
			// Delivery must be checked by delivery filter.
			need_deliver = m_filter->check( subscriber_reference(), msg ) ?
					delivery_possibility_t::must_be_delivered :
					delivery_possibility_t::disabled_by_delivery_filter;

		return need_deliver;
	}